

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::GCDMIVTest
          (LoopDependenceAnalysis *this,
          pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair)

{
  SENode *node;
  SENode *node_00;
  bool bVar1;
  int iVar2;
  type *ppSVar3;
  type *ppSVar4;
  int64_t iVar5;
  undefined4 extraout_var;
  int64_t running_gcd;
  int64_t delta;
  int64_t destination_constant;
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  dest_constants;
  int64_t source_constant;
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  source_constants;
  undefined1 local_60 [8];
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  dest_recurrences;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  source_recurrences;
  type destination;
  type source;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair_local;
  LoopDependenceAnalysis *this_local;
  
  ppSVar3 = std::get<0ul,spvtools::opt::SENode*,spvtools::opt::SENode*>(subscript_pair);
  node = *ppSVar3;
  ppSVar4 = std::get<1ul,spvtools::opt::SENode*,spvtools::opt::SENode*>(subscript_pair);
  node_00 = *ppSVar4;
  bVar1 = anon_unknown_15::IsInCorrectFormForGCDTest(node);
  if ((bVar1) && (bVar1 = anon_unknown_15::IsInCorrectFormForGCDTest(node_00), bVar1)) {
    anon_unknown_15::GetAllTopLevelRecurrences
              ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *)&dest_recurrences.
                   super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,node);
    anon_unknown_15::GetAllTopLevelRecurrences
              ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *)local_60,node_00);
    bVar1 = anon_unknown_15::AreOffsetsAndCoefficientsConstant
                      ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                        *)&dest_recurrences.
                           super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((bVar1) &&
       (bVar1 = anon_unknown_15::AreOffsetsAndCoefficientsConstant
                          ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                            *)local_60), bVar1)) {
      anon_unknown_15::GetAllTopLevelConstants
                ((vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                  *)&source_constant,node);
      dest_constants.
      super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)anon_unknown_15::CalculateConstantTerm
                              ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                                *)&dest_recurrences.
                                   super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                                *)&source_constant);
      anon_unknown_15::GetAllTopLevelConstants
                ((vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                  *)&destination_constant,node_00);
      iVar5 = anon_unknown_15::CalculateConstantTerm
                        ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                          *)local_60,
                         (vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                          *)&destination_constant);
      iVar2 = std::abs((int)dest_constants.
                            super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage - (int)iVar5);
      iVar5 = anon_unknown_15::CalculateGCDFromCoefficients
                        ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                          *)&dest_recurrences.
                             super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      iVar5 = anon_unknown_15::CalculateGCDFromCoefficients
                        ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                          *)local_60,iVar5);
      this_local._7_1_ = CONCAT44(extraout_var,iVar2) % iVar5 != 0;
      source_constants.
      super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      std::vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
      ::~vector((vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                 *)&destination_constant);
      std::vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
      ::~vector((vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                 *)&source_constant);
    }
    else {
      this_local._7_1_ = false;
      source_constants.
      super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
    ::~vector((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
               *)local_60);
    std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
    ::~vector((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
               *)&dest_recurrences.
                  super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool LoopDependenceAnalysis::GCDMIVTest(
    const std::pair<SENode*, SENode*>& subscript_pair) {
  auto source = std::get<0>(subscript_pair);
  auto destination = std::get<1>(subscript_pair);

  // Bail out if source/destination is in an unexpected form.
  if (!IsInCorrectFormForGCDTest(source) ||
      !IsInCorrectFormForGCDTest(destination)) {
    return false;
  }

  auto source_recurrences = GetAllTopLevelRecurrences(source);
  auto dest_recurrences = GetAllTopLevelRecurrences(destination);

  // Bail out if all offsets and coefficients aren't constant.
  if (!AreOffsetsAndCoefficientsConstant(source_recurrences) ||
      !AreOffsetsAndCoefficientsConstant(dest_recurrences)) {
    return false;
  }

  // Calculate the GCD of all coefficients.
  auto source_constants = GetAllTopLevelConstants(source);
  int64_t source_constant =
      CalculateConstantTerm(source_recurrences, source_constants);

  auto dest_constants = GetAllTopLevelConstants(destination);
  int64_t destination_constant =
      CalculateConstantTerm(dest_recurrences, dest_constants);

  int64_t delta = std::abs(source_constant - destination_constant);

  int64_t running_gcd = 0;

  running_gcd = CalculateGCDFromCoefficients(source_recurrences, running_gcd);
  running_gcd = CalculateGCDFromCoefficients(dest_recurrences, running_gcd);

  return delta % running_gcd != 0;
}